

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_chk2_m68k(CPUM68KState_conflict *env,int32_t val,int32_t lb,int32_t ub)

{
  CPUState *cpu;
  uintptr_t unaff_retaddr;
  bool local_31;
  uint local_30;
  bool local_2a;
  bool local_29;
  CPUState *cs;
  int32_t ub_local;
  int32_t lb_local;
  int32_t val_local;
  CPUM68KState_conflict *env_local;
  
  local_29 = val != lb && val != ub;
  env->cc_z = (uint)local_29;
  if (ub < lb) {
    local_31 = ub < val && val < lb;
    local_2a = local_31;
  }
  else {
    local_2a = val < lb || ub < val;
  }
  local_30 = (uint)local_2a;
  env->cc_c = local_30;
  if (env->cc_c != 0) {
    cpu = env_cpu(env);
    cpu_restore_state_m68k(cpu,unaff_retaddr,true);
    env->cc_op = 1;
    env->pc = env->pc + 4;
    cpu->exception_index = 6;
    cpu_loop_exit_m68k(cpu);
  }
  return;
}

Assistant:

void HELPER(chk2)(CPUM68KState *env, int32_t val, int32_t lb, int32_t ub)
{
    /*
     * From the specs:
     *   X: Not affected, N,V: Undefined,
     *   Z: Set if val is equal to lb or ub
     *   C: Set if val < lb or val > ub, cleared otherwise
     * We implement here values found from a real MC68040:
     *   X,N,V: Not affected
     *   Z: Set if val is equal to lb or ub
     *   C: if lb <= ub: set if val < lb or val > ub, cleared otherwise
     *      if lb > ub: set if val > ub and val < lb, cleared otherwise
     */
    env->cc_z = val != lb && val != ub;
    env->cc_c = lb <= ub ? val < lb || val > ub : val > ub && val < lb;

    if (env->cc_c) {
        CPUState *cs = env_cpu(env);

        /* Recover PC and CC_OP for the beginning of the insn.  */
        cpu_restore_state(cs, GETPC(), true);

        /* flags have been modified by gen_flush_flags() */
        env->cc_op = CC_OP_FLAGS;
        /* Adjust PC to end of the insn.  */
        env->pc += 4;

        cs->exception_index = EXCP_CHK;
        cpu_loop_exit(cs);
    }
}